

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

bool __thiscall
Lowerer::LinkCtorCacheToGuardedProperties(Lowerer *this,JITTimeConstructorCache *ctorCache)

{
  code *pcVar1;
  int iVar2;
  JITTimeConstructorCache *this_00;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  BVSparse<Memory::JitArenaAllocator> *pBVar6;
  FunctionJITTimeInfo *pFVar7;
  undefined4 *puVar8;
  ObjTypeSpecFldInfo *this_01;
  JITTimeFunctionBody *pJVar9;
  intptr_t iVar10;
  JITType *this_02;
  intptr_t iVar11;
  undefined8 extraout_RAX;
  Type_conflict pBVar12;
  ulong uVar13;
  ulong uVar14;
  wchar local_d8 [4];
  char16 debugStringBuffer [42];
  JITTypeHolderBase<void> local_78;
  ulong local_70;
  char16 *local_68;
  undefined4 *local_60;
  Type_conflict local_58;
  Phases *local_50;
  JITTimeConstructorCache *local_48;
  uint local_3c;
  undefined8 local_38;
  
  local_48 = ctorCache;
  pBVar6 = JITTimeConstructorCache::GetGuardedPropOps(ctorCache);
  if (pBVar6 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    pFVar7 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
    bVar3 = FunctionJITTimeInfo::HasSharedPropertyGuards(pFVar7);
    if (bVar3) {
      pBVar6 = JITTimeConstructorCache::GetGuardedPropOps(local_48);
      pFVar7 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
      bVar3 = FunctionJITTimeInfo::HasSharedPropertyGuards(pFVar7);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1fd8,
                           "(this->m_func->GetWorkItem()->GetJITTimeInfo()->HasSharedPropertyGuards())"
                           ,
                           "this->m_func->GetWorkItem()->GetJITTimeInfo()->HasSharedPropertyGuards()"
                          );
        if (!bVar3) goto LAB_005c5af0;
        *puVar8 = 0;
      }
      if (pBVar6 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1fd9,"(guardedPropOps != nullptr)","guardedPropOps != nullptr");
        if (!bVar3) {
LAB_005c5af0:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar8 = 0;
      }
      pBVar12 = pBVar6->head;
      if (pBVar12 != (Type_conflict)0x0) {
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        local_38 = (char16 *)((ulong)local_38._4_4_ << 0x20);
        local_50 = (Phases *)&DAT_015b6718;
        local_60 = puVar8;
        do {
          uVar14 = (pBVar12->data).word;
          local_58 = pBVar12;
          if (uVar14 != 0) {
            local_70 = (ulong)pBVar12->startIndex;
            uVar13 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
              }
            }
            do {
              iVar2 = (int)local_70;
              BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar13);
              this_01 = Func::GetGlobalObjTypeSpecFldInfo(this->m_func,iVar2 + (BVIndex)uVar13);
              local_3c = ObjTypeSpecFldInfo::GetPropertyId(this_01);
              bVar3 = ObjTypeSpecFldInfo::IsBeingAdded(this_01);
              if (((bVar3) || (bVar3 = ObjTypeSpecFldInfo::IsLoadedFromProto(this_01), bVar3)) ||
                 (bVar3 = ObjTypeSpecFldInfo::HasFixedValue(this_01), bVar3)) {
                bVar3 = ObjTypeSpecFldInfo::IsPoly(this_01);
                if (((bVar3) && (bVar3 = ObjTypeSpecFldInfo::HasFixedValue(this_01), bVar3)) &&
                   ((bVar3 = ObjTypeSpecFldInfo::IsLoadedFromProto(this_01), !bVar3 &&
                    (bVar3 = ObjTypeSpecFldInfo::UsesAccessor(this_01), !bVar3)))) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar8 = 1;
                  bVar3 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                     ,0x1fee,
                                     "(!propertyOpInfo->IsPoly() || (!propertyOpInfo->HasFixedValue() || propertyOpInfo->IsLoadedFromProto() || propertyOpInfo->UsesAccessor()))"
                                     ,
                                     "!propertyOpInfo->IsPoly() || (!propertyOpInfo->HasFixedValue() || propertyOpInfo->IsLoadedFromProto() || propertyOpInfo->UsesAccessor())"
                                    );
                  if (!bVar3) goto LAB_005c5af0;
                  *puVar8 = 0;
                }
                pFVar7 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
                bVar3 = FunctionJITTimeInfo::HasSharedPropertyGuard(pFVar7,local_3c);
                if (bVar3) {
                  pJVar9 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
                  uVar4 = JITTimeFunctionBody::GetSourceContextId(pJVar9);
                  pFVar7 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
                  uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar7);
                  bVar3 = Js::Phases::IsEnabled(local_50,ObjTypeSpecPhase,uVar4,uVar5);
                  if (bVar3) {
LAB_005c59c3:
                    pJVar9 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
                    local_38 = JITTimeFunctionBody::GetDisplayName(pJVar9);
                    pFVar7 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
                    local_68 = FunctionJITTimeInfo::GetDebugNumberSet
                                         (pFVar7,(wchar (*) [42])local_d8);
                    this_00 = local_48;
                    iVar10 = JITTimeConstructorCache::GetRuntimeCacheAddr(local_48);
                    local_78.t = (Type)JITTimeConstructorCache::GetType(this_00);
                    this_02 = JITTypeHolderBase<void>::operator->(&local_78);
                    iVar11 = JITType::GetAddr(this_02);
                    puVar8 = local_60;
                    Output::Print(L"ObjTypeSpec: function %s(%s) registered ctor cache 0x%p with value 0x%p for property %u.\n"
                                  ,local_38,local_68,iVar10,iVar11,(ulong)local_3c);
                    Output::Flush();
                  }
                  else {
                    pJVar9 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
                    uVar4 = JITTimeFunctionBody::GetSourceContextId(pJVar9);
                    pFVar7 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
                    uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar7);
                    bVar3 = Js::Phases::IsEnabled(local_50,TracePropertyGuardsPhase,uVar4,uVar5);
                    if (bVar3) goto LAB_005c59c3;
                  }
                  Func::EnsureCtorCachesByPropertyId(this->m_func);
                  Func::LinkCtorCacheToPropertyId(this->m_func,local_3c,local_48);
                  local_38 = (char16 *)
                             CONCAT44(local_38._4_4_,
                                      (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1));
                }
                else {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar8 = 1;
                  bVar3 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                     ,0x1ff7,"(false)",
                                     "Did we fail to create a shared property guard for a guarded property?"
                                    );
                  if (!bVar3) goto LAB_005c5af0;
                  *puVar8 = 0;
                }
              }
              uVar14 = uVar14 & ~(1L << (uVar13 & 0x3f));
              uVar13 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                }
              }
            } while (uVar14 != 0);
          }
          pBVar12 = local_58->next;
        } while (pBVar12 != (Type)0x0);
        goto LAB_005c5ad9;
      }
    }
  }
  local_38 = (char16 *)0x0;
LAB_005c5ad9:
  return (bool)((byte)local_38 & 1);
}

Assistant:

bool
Lowerer::LinkCtorCacheToGuardedProperties(JITTimeConstructorCache* ctorCache)
{
    // We do not always have guarded properties. If the constructor is empty and the subsequent code doesn't load or store any of
    // the constructed object's properties, or if all inline caches are empty then this ctor cache doesn't guard any properties.
    if (ctorCache->GetGuardedPropOps() == nullptr)
    {
        return false;
    }

    bool linked = false;

    if (this->m_func->GetWorkItem()->GetJITTimeInfo()->HasSharedPropertyGuards())
    {
        linked = LinkGuardToGuardedProperties(ctorCache->GetGuardedPropOps(), [=](Js::PropertyId propertyId)
        {
            if (PHASE_TRACE(Js::ObjTypeSpecPhase, this->m_func) || PHASE_TRACE(Js::TracePropertyGuardsPhase, this->m_func))
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                Output::Print(_u("ObjTypeSpec: function %s(%s) registered ctor cache 0x%p with value 0x%p for property %u.\n"),
                    this->m_func->GetJITFunctionBody()->GetDisplayName(), this->m_func->GetDebugNumberSet(debugStringBuffer),
                    ctorCache->GetRuntimeCacheAddr(), ctorCache->GetType()->GetAddr(), propertyId);
                Output::Flush();
            }

            this->m_func->EnsureCtorCachesByPropertyId();
            this->m_func->LinkCtorCacheToPropertyId(propertyId, ctorCache);
        });
    }
    return linked;
}